

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArHosekSkyModel.c
# Opt level: O2

double art_blackbody_dd_value(double temperature,double lambda)

{
  double dVar1;
  double dVar2;
  undefined1 auVar3 [16];
  
  dVar1 = pow(lambda,5.0);
  dVar2 = exp(0.0143878 / (temperature * lambda));
  auVar3._8_4_ = SUB84(dVar2 + -1.0,0);
  auVar3._0_8_ = dVar1;
  auVar3._12_4_ = (int)((ulong)(dVar2 + -1.0) >> 0x20);
  auVar3 = divpd(_DAT_02eda610,auVar3);
  return auVar3._8_8_ * auVar3._0_8_;
}

Assistant:

double art_blackbody_dd_value(
        const double  temperature,
        const double  lambda
        )
{
    double  c1 = 3.74177 * 10E-17;
    double  c2 = 0.0143878;
    double  value;
    
    value =   ( c1 / ( pow( lambda, 5.0 ) ) )
            * ( 1.0 / ( exp( c2 / ( lambda * temperature ) ) - 1.0 ) );

    return value;
}